

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymbol * __thiscall CTcPrsSymtab::find_delete_weak(CTcPrsSymtab *this,char *name,size_t len)

{
  tc_symtype_t tVar1;
  int iVar2;
  CTcSymPropBase *this_00;
  long *in_RDI;
  CTcSymbol *sym;
  CTcPrsSymtab *in_stack_ffffffffffffffe0;
  
  this_00 = (CTcSymPropBase *)find(in_stack_ffffffffffffffe0,(textchar_t *)in_RDI,0x25befb);
  if (this_00 != (CTcSymPropBase *)0x0) {
    tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00);
    if (tVar1 == TC_SYM_PROP) {
      iVar2 = CTcSymPropBase::is_weak(this_00);
      if (iVar2 != 0) {
        (**(code **)(*in_RDI + 0x20))(in_RDI,this_00);
        this_00 = (CTcSymPropBase *)0x0;
      }
    }
  }
  return &this_00->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_delete_weak(const char *name, size_t len)
{
    /* look up the symbol */
    CTcSymbol *sym = find(name, len);

    /* if it's a weak property definition, delete it */
    if (sym != 0
        && sym->get_type() == TC_SYM_PROP
        && ((CTcSymProp *)sym)->is_weak())
    {
        /* delete it and forget it */
        remove_entry(sym);
        sym = 0;
    }

    /* return what we found */
    return sym;
}